

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::TiledOutputFile::writeTiles
          (TiledOutputFile *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly)

{
  int iVar1;
  TileMap *this_00;
  _Rb_tree_header *p_Var2;
  TileCoord *a;
  size_t *psVar3;
  pthread_mutex_t *__mutex;
  Data *pDVar4;
  pointer ppTVar5;
  TileBuffer *pTVar6;
  OutputStreamMutex *streamData;
  char *pixelData;
  _Base_ptr p_Var7;
  undefined1 auVar8 [16];
  _Rb_tree_node_base *p_Var9;
  bool bVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  TileBufferTask *pTVar15;
  uint64_t *puVar16;
  iterator iVar17;
  void *pvVar18;
  _Base_ptr p_Var19;
  _Rb_tree_node_base *p_Var20;
  ostream *poVar21;
  ArgExc *pAVar22;
  IoExc *this_01;
  int iVar23;
  int iVar24;
  _Rb_tree_node_base *p_Var25;
  uint uVar26;
  long lVar27;
  TileCoord *__y;
  TileCoord *__y_00;
  _Rb_tree_node_base *p_Var28;
  string *psVar29;
  int iVar30;
  string *psVar32;
  ulong uVar33;
  uint uVar34;
  _Rb_tree_node_base *__x;
  TileCoord TVar35;
  undefined1 auVar36 [16];
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar37;
  int local_3cc;
  uint local_3c4;
  TileCoord currentTile;
  stringstream _iex_throw_s;
  ostream local_330 [376];
  TaskGroup taskGroup;
  int iVar31;
  
  __mutex = (pthread_mutex_t *)this->_streamData;
  iVar11 = pthread_mutex_lock(__mutex);
  if (iVar11 != 0) {
    std::__throw_system_error(iVar11);
  }
  pDVar4 = this->_data;
  if ((pDVar4->slices).
      super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pDVar4->slices).
      super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pAVar22 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar22,"No frame buffer specified as pixel data source.");
  }
  else {
    bVar10 = isValidTile(this,dx1,dy1,lx,ly);
    if ((bVar10) && (bVar10 = isValidTile(this,dx2,dy2,lx,ly), bVar10)) {
      if (((ly | lx) < 0) ||
         ((((lx != ly && ((pDVar4->tileDesc).mode == MIPMAP_LEVELS)) || (pDVar4->numXLevels <= lx))
          || (pDVar4->numYLevels <= ly)))) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        std::__ostream_insert<char,std::char_traits<char>>(local_330,"Level coordinate (",0x12);
        poVar21 = (ostream *)std::ostream::operator<<((ostream *)local_330,lx);
        std::__ostream_insert<char,std::char_traits<char>>(poVar21,", ",2);
        poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,ly);
        std::__ostream_insert<char,std::char_traits<char>>(poVar21,") is invalid.",0xd);
        pAVar22 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar22,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar22,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      iVar11 = dx2;
      if (dx2 < dx1) {
        iVar11 = dx1;
      }
      lVar13 = (long)dx2;
      if (dx1 < dx2) {
        dx2 = dx1;
      }
      iVar23 = dy2;
      if (dy2 < dy1) {
        iVar23 = dy1;
      }
      lVar27 = (long)dy2;
      if (dy1 < dy2) {
        dy2 = dy1;
      }
      bVar10 = pDVar4->lineOrder != DECREASING_Y;
      local_3cc = dy2;
      if (!bVar10) {
        local_3cc = iVar23;
      }
      lVar13 = dx1 - lVar13;
      lVar14 = -lVar13;
      if (0 < lVar13) {
        lVar14 = lVar13;
      }
      lVar27 = dy1 - lVar27;
      lVar13 = -lVar27;
      if (0 < lVar27) {
        lVar13 = lVar27;
      }
      uVar26 = ((int)lVar13 + 1) * ((int)lVar14 + 1);
      uVar34 = (uint)((ulong)((long)(pDVar4->tileBuffers).
                                    super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pDVar4->tileBuffers).
                                   super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
      if ((int)uVar26 < (int)uVar34) {
        uVar34 = uVar26;
      }
      IlmThread_3_4::TaskGroup::TaskGroup(&taskGroup);
      iVar12 = (uint)bVar10 * 2 + -1;
      iVar30 = local_3cc;
      iVar23 = dx2;
      if ((int)uVar34 < 1) {
        local_3c4 = 0;
      }
      else {
        local_3c4 = 0;
        do {
          pTVar15 = (TileBufferTask *)operator_new(0x20);
          anon_unknown_6::TileBufferTask::TileBufferTask
                    (pTVar15,&taskGroup,this->_data,local_3c4,iVar23,iVar30,lx,ly);
          IlmThread_3_4::ThreadPool::addGlobalTask((Task *)pTVar15);
          local_3c4 = local_3c4 + 1;
          iVar1 = iVar23 + 1;
          bVar10 = iVar23 < iVar11;
          iVar31 = iVar12;
          iVar23 = dx2;
          if (bVar10) {
            iVar31 = 0;
            iVar23 = iVar1;
          }
          iVar30 = iVar31 + iVar30;
        } while (uVar34 != local_3c4);
      }
      if (0 < (int)uVar26) {
        uVar33 = 0;
        iVar1 = dx2;
        do {
          ppTVar5 = (this->_data->tileBuffers).
                    super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pTVar6 = ppTVar5[uVar33 % (ulong)((long)(this->_data->tileBuffers).
                                                  super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)ppTVar5 >> 3)];
          IlmThread_3_4::Semaphore::wait();
          pDVar4 = this->_data;
          streamData = this->_streamData;
          pixelData = pTVar6->dataPtr;
          iVar31 = (int)pTVar6->dataSize;
          puVar16 = TileOffsets::operator()(&pDVar4->tileOffsets,iVar1,local_3cc,lx,ly);
          if (*puVar16 != 0) {
            iex_debugTrap();
            std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_330,"Attempt to write tile (",0x17);
            poVar21 = (ostream *)std::ostream::operator<<((ostream *)local_330,iVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar21,", ",2);
            poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,local_3cc);
            std::__ostream_insert<char,std::char_traits<char>>(poVar21,", ",2);
            poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,lx);
            std::__ostream_insert<char,std::char_traits<char>>(poVar21,", ",2);
            poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,ly);
            std::__ostream_insert<char,std::char_traits<char>>(poVar21,") more than once.",0x11);
            pAVar22 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::ArgExc::ArgExc(pAVar22,(stringstream *)&_iex_throw_s);
            __cxa_throw(pAVar22,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
          }
          if (pDVar4->lineOrder == RANDOM_Y) {
            anon_unknown_6::writeTileData(streamData,pDVar4,iVar1,local_3cc,lx,ly,pixelData,iVar31);
          }
          else {
            currentTile.dy = local_3cc;
            currentTile.ly = ly;
            this_00 = &pDVar4->tileMap;
            currentTile.dx = iVar1;
            currentTile.lx = lx;
            iVar17 = std::
                     map<Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_4::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>_>
                     ::find(this_00,&currentTile);
            p_Var2 = &(pDVar4->tileMap)._M_t._M_impl.super__Rb_tree_header;
            if ((_Rb_tree_header *)iVar17._M_node != p_Var2) {
              iex_debugTrap();
              std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_330,"Attempt to write tile (",0x17);
              poVar21 = (ostream *)std::ostream::operator<<((ostream *)local_330,iVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar21,", ",2);
              poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,local_3cc);
              std::__ostream_insert<char,std::char_traits<char>>(poVar21,", ",2);
              poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,lx);
              std::__ostream_insert<char,std::char_traits<char>>(poVar21,", ",2);
              poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,ly);
              std::__ostream_insert<char,std::char_traits<char>>(poVar21,") more than once.",0x11);
              pAVar22 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_3_4::ArgExc::ArgExc(pAVar22,(stringstream *)&_iex_throw_s);
              __cxa_throw(pAVar22,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
            }
            if ((((pDVar4->nextTileToWrite).lx == lx) && ((pDVar4->nextTileToWrite).ly == ly)) &&
               ((a = &pDVar4->nextTileToWrite, a->dx == iVar1 &&
                ((pDVar4->nextTileToWrite).dy == local_3cc)))) {
              anon_unknown_6::writeTileData
                        (streamData,pDVar4,iVar1,local_3cc,lx,ly,pixelData,iVar31);
              TVar35 = Data::nextTileCoord(pDVar4,a);
              pDVar4->nextTileToWrite = TVar35;
              iVar17 = std::
                       map<Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_4::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>_>
                       ::find(this_00,a);
              while ((_Rb_tree_header *)iVar17._M_node != p_Var2) {
                anon_unknown_6::writeTileData
                          (streamData,pDVar4,iVar17._M_node[1]._M_color,
                           *(int *)&iVar17._M_node[1].field_0x4,*(int *)&iVar17._M_node[1]._M_parent
                           ,*(int *)((long)&iVar17._M_node[1]._M_parent + 4),
                           *(char **)iVar17._M_node[1]._M_left,
                           *(int *)&(iVar17._M_node[1]._M_left)->_M_parent);
                p_Var7 = iVar17._M_node[1]._M_left;
                if (p_Var7 != (_Base_ptr)0x0) {
                  if (*(void **)p_Var7 != (void *)0x0) {
                    operator_delete__(*(void **)p_Var7);
                  }
                  operator_delete(p_Var7,0x10);
                }
                pvVar18 = (void *)std::_Rb_tree_rebalance_for_erase
                                            (iVar17._M_node,&p_Var2->_M_header);
                operator_delete(pvVar18,0x38);
                psVar3 = &(pDVar4->tileMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
                *psVar3 = *psVar3 - 1;
                TVar35 = Data::nextTileCoord(pDVar4,a);
                pDVar4->nextTileToWrite = TVar35;
                iVar17 = std::
                         map<Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_4::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>_>
                         ::find(this_00,a);
              }
            }
            else {
              p_Var19 = (_Base_ptr)operator_new(0x10);
              *(undefined8 *)p_Var19 = 0;
              *(int *)&p_Var19->_M_parent = iVar31;
              pvVar18 = operator_new__((long)iVar31);
              *(void **)p_Var19 = pvVar18;
              memcpy(pvVar18,pixelData,(long)iVar31);
              p_Var7 = (pDVar4->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var25 = &p_Var2->_M_header;
              for (; p_Var7 != (_Base_ptr)0x0; p_Var7 = (&p_Var7->_M_left)[bVar10]) {
                iVar31 = *(int *)((long)&p_Var7[1]._M_parent + 4);
                bVar10 = true;
                if (ly <= iVar31) {
                  if (iVar31 == ly) {
                    iVar31 = *(int *)&p_Var7[1]._M_parent;
                    bVar10 = iVar31 < lx;
                    if (lx <= iVar31) {
                      if (iVar31 != lx) goto LAB_001a91f8;
                      bVar10 = true;
                      if (local_3cc <= *(int *)&p_Var7[1].field_0x4) {
                        if (*(int *)&p_Var7[1].field_0x4 != local_3cc) goto LAB_001a91f8;
                        bVar10 = (int)p_Var7[1]._M_color < iVar1;
                      }
                    }
                  }
                  else {
LAB_001a91f8:
                    bVar10 = false;
                  }
                }
                if (bVar10 == false) {
                  p_Var25 = p_Var7;
                }
              }
              if (((_Rb_tree_header *)p_Var25 == p_Var2) ||
                 (iVar31 = *(int *)((long)&p_Var25[1]._M_parent + 4), ly < iVar31)) {
LAB_001a921d:
                p_Var20 = (_Rb_tree_node_base *)operator_new(0x38);
                __x = p_Var20 + 1;
                *(ulong *)(p_Var20 + 1) = CONCAT44(currentTile.dy,currentTile.dx);
                p_Var20[1]._M_parent = (_Base_ptr)CONCAT44(currentTile.ly,currentTile.lx);
                p_Var20[1]._M_left = (_Base_ptr)0x0;
                if ((_Rb_tree_header *)p_Var25 == p_Var2) {
                  if ((pDVar4->tileMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                    p_Var7 = (pDVar4->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                    ;
                    bVar10 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                       ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)
                                        (p_Var7 + 1),(TileCoord *)__x,__y);
                    if (bVar10) {
                      auVar36._8_8_ = 0;
                      auVar36._0_8_ = p_Var7;
                      pVar37 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)
                               (auVar36 << 0x40);
                      goto LAB_001a93b3;
                    }
                  }
LAB_001a935f:
                  pVar37 = std::
                           _Rb_tree<Imf_3_4::(anonymous_namespace)::TileCoord,_std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>,_std::_Select1st<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>,_std::less<Imf_3_4::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>_>
                           ::_M_get_insert_unique_pos(&this_00->_M_t,(key_type *)__x);
                }
                else {
                  bVar10 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                     ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)__x,
                                      (TileCoord *)(p_Var25 + 1),__y);
                  if (bVar10) {
                    p_Var7 = (pDVar4->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                    pVar37.second = p_Var7;
                    pVar37.first = p_Var7;
                    if (p_Var7 != p_Var25) {
                      auVar36 = std::_Rb_tree_decrement(p_Var25);
                      p_Var28 = auVar36._0_8_;
                      bVar10 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                         ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)
                                          (p_Var28 + 1),(TileCoord *)__x,auVar36._8_8_);
                      if (bVar10) {
                        p_Var9 = p_Var25;
                        if (p_Var28->_M_right == (_Base_ptr)0x0) {
                          p_Var25 = p_Var28;
                          p_Var9 = (_Rb_tree_node_base *)0x0;
                        }
                        pVar37.second = p_Var25;
                        pVar37.first = p_Var9;
                      }
                      else {
                        pVar37 = std::
                                 _Rb_tree<Imf_3_4::(anonymous_namespace)::TileCoord,_std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>,_std::_Select1st<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>,_std::less<Imf_3_4::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>_>
                                 ::_M_get_insert_unique_pos(&this_00->_M_t,(key_type *)__x);
                      }
                    }
                  }
                  else {
                    bVar10 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                       ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)
                                        (p_Var25 + 1),(TileCoord *)__x,__y_00);
                    if (bVar10) {
                      p_Var7 = (pDVar4->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                               _M_right;
                      if (p_Var7 == p_Var25) {
                        auVar8._8_8_ = 0;
                        auVar8._0_8_ = p_Var7;
                        pVar37 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)
                                 (auVar8 << 0x40);
                      }
                      else {
                        auVar36 = std::_Rb_tree_increment(p_Var25);
                        p_Var28 = auVar36._0_8_;
                        bVar10 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                           ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)__x,
                                            (TileCoord *)(p_Var28 + 1),auVar36._8_8_);
                        if (!bVar10) goto LAB_001a935f;
                        p_Var9 = p_Var28;
                        if (p_Var25->_M_right == (_Base_ptr)0x0) {
                          p_Var28 = p_Var25;
                          p_Var9 = (_Rb_tree_node_base *)0x0;
                        }
                        pVar37.second = p_Var28;
                        pVar37.first = p_Var9;
                      }
                    }
                    else {
                      pVar37.second = (_Rb_tree_node_base *)0x0;
                      pVar37.first = p_Var25;
                    }
                  }
                }
LAB_001a93b3:
                p_Var28 = pVar37.second;
                p_Var25 = pVar37.first;
                if (p_Var28 == (_Rb_tree_node_base *)0x0) {
                  operator_delete(p_Var20,0x38);
                }
                else {
                  bVar10 = true;
                  if ((p_Var25 == (_Rb_tree_node_base *)0x0) &&
                     (p_Var2 != (_Rb_tree_header *)p_Var28)) {
                    bVar10 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                       ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)__x,
                                        (TileCoord *)(p_Var28 + 1),(TileCoord *)p_Var28);
                  }
                  std::_Rb_tree_insert_and_rebalance(bVar10,p_Var20,p_Var28,&p_Var2->_M_header);
                  psVar3 = &(pDVar4->tileMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
                  *psVar3 = *psVar3 + 1;
                  p_Var25 = p_Var20;
                }
              }
              else if (iVar31 == ly) {
                iVar31 = *(int *)&p_Var25[1]._M_parent;
                bVar10 = lx < iVar31;
                if (lx < iVar31) {
LAB_001a92c4:
                  if (bVar10) goto LAB_001a921d;
                }
                else if (iVar31 == lx) {
                  if (local_3cc < *(int *)&p_Var25[1].field_0x4) goto LAB_001a921d;
                  if (*(int *)&p_Var25[1].field_0x4 == local_3cc) {
                    bVar10 = iVar1 < (int)p_Var25[1]._M_color;
                    goto LAB_001a92c4;
                  }
                }
              }
              p_Var25[1]._M_left = p_Var19;
            }
          }
          IlmThread_3_4::Semaphore::post();
          if ((int)local_3c4 < (int)uVar26) {
            pTVar15 = (TileBufferTask *)operator_new(0x20);
            anon_unknown_6::TileBufferTask::TileBufferTask
                      (pTVar15,&taskGroup,this->_data,local_3c4,iVar23,iVar30,lx,ly);
            IlmThread_3_4::ThreadPool::addGlobalTask((Task *)pTVar15);
          }
          uVar33 = uVar33 + 1;
          iVar31 = iVar1 + 1;
          if (iVar11 <= iVar1) {
            iVar31 = dx2;
          }
          iVar24 = iVar12;
          if (iVar1 < iVar11) {
            iVar24 = 0;
          }
          local_3cc = local_3cc + iVar24;
          local_3c4 = local_3c4 + 1;
          iVar24 = iVar23 + 1;
          bVar10 = iVar23 < iVar11;
          iVar1 = iVar12;
          iVar23 = dx2;
          if (bVar10) {
            iVar1 = 0;
            iVar23 = iVar24;
          }
          iVar30 = iVar30 + iVar1;
          iVar1 = iVar31;
        } while (uVar33 != uVar26);
      }
      IlmThread_3_4::TaskGroup::~TaskGroup(&taskGroup);
      ppTVar5 = (this->_data->tileBuffers).
                super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar13 = (long)(this->_data->tileBuffers).
                     super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5;
      if (lVar13 == 0) {
        psVar29 = (string *)0x0;
      }
      else {
        lVar13 = lVar13 >> 3;
        lVar27 = 0;
        psVar32 = (string *)0x0;
        do {
          pTVar6 = ppTVar5[lVar27];
          psVar29 = (string *)&pTVar6->sampleCountTablePtr;
          if (psVar32 != (string *)0x0) {
            psVar29 = psVar32;
          }
          if (*(char *)&(pTVar6->sampleCountTableBuffer)._data == '\0') {
            psVar29 = psVar32;
          }
          *(undefined1 *)&(pTVar6->sampleCountTableBuffer)._data = 0;
          lVar27 = lVar27 + 1;
          psVar32 = psVar29;
        } while (lVar13 + (ulong)(lVar13 == 0) != lVar27);
      }
      if (psVar29 == (string *)0x0) {
        pthread_mutex_unlock(__mutex);
        return;
      }
      this_01 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::IoExc::IoExc(this_01,psVar29);
      __cxa_throw(this_01,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
    }
    pAVar22 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar22,"Tile coordinates are invalid.");
  }
  __cxa_throw(pAVar22,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
TiledOutputFile::writeTiles (int dx1, int dx2, int dy1, int dy2, int lx, int ly)
{
    try
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_streamData);
#endif
        if (_data->slices.size () == 0)
            throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
                                         "as pixel data source.");

        if (!isValidTile (dx1, dy1, lx, ly) || !isValidTile (dx2, dy2, lx, ly))
            throw IEX_NAMESPACE::ArgExc ("Tile coordinates are invalid.");

        if (!isValidLevel (lx, ly))
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Level coordinate "
                "(" << lx
                    << ", " << ly
                    << ") "
                       "is invalid.");
        //
        // Determine the first and last tile coordinates in both dimensions
        // based on the file's lineOrder
        //

        if (dx1 > dx2) swap (dx1, dx2);

        if (dy1 > dy2) swap (dy1, dy2);

        int dyStart = dy1;
        int dY      = 1;

        if (_data->lineOrder == DECREASING_Y)
        {
            dyStart = dy2;
            dY      = -1;
        }

        int numTiles = (dx2 - dx1 + 1) * (dy2 - dy1 + 1);
        int numTasks = min ((int) _data->tileBuffers.size (), numTiles);

        //
        // Create a task group for all tile buffer tasks.  When the
        // task group goes out of scope, the destructor waits until
        // all tasks are complete.
        //

        {
            TaskGroup taskGroup;

            //
            // Add in the initial compression tasks to the thread pool
            //

            int nextCompBuffer = 0;
            int dxComp         = dx1;
            int dyComp         = dyStart;

            while (nextCompBuffer < numTasks)
            {
                ThreadPool::addGlobalTask (new TileBufferTask (
                    &taskGroup,
                    _data,
                    nextCompBuffer++,
                    dxComp,
                    dyComp,
                    lx,
                    ly));
                dxComp++;

                if (dxComp > dx2)
                {
                    dxComp = dx1;
                    dyComp += dY;
                }
            }

            //
            // Write the compressed buffers and add in more compression
            // tasks until done
            //

            int nextWriteBuffer = 0;
            int dxWrite         = dx1;
            int dyWrite         = dyStart;

            while (nextWriteBuffer < numTiles)
            {
                //
                // Wait until the nextWriteBuffer is ready to be written
                //

                TileBuffer* writeBuffer =
                    _data->getTileBuffer (nextWriteBuffer);

                writeBuffer->wait ();

                //
                // Write the tilebuffer
                //

                bufferedTileWrite (
                    _streamData,
                    _data,
                    dxWrite,
                    dyWrite,
                    lx,
                    ly,
                    writeBuffer->dataPtr,
                    writeBuffer->dataSize);

                //
                // Release the lock on nextWriteBuffer
                //

                writeBuffer->post ();

                //
                // If there are no more tileBuffers to compress, then
                // only continue to write out remaining tileBuffers,
                // otherwise keep adding compression tasks.
                //

                if (nextCompBuffer < numTiles)
                {
                    //
                    // add nextCompBuffer as a compression Task
                    //

                    ThreadPool::addGlobalTask (new TileBufferTask (
                        &taskGroup,
                        _data,
                        nextCompBuffer,
                        dxComp,
                        dyComp,
                        lx,
                        ly));
                }

                nextWriteBuffer++;
                dxWrite++;

                if (dxWrite > dx2)
                {
                    dxWrite = dx1;
                    dyWrite += dY;
                }

                nextCompBuffer++;
                dxComp++;

                if (dxComp > dx2)
                {
                    dxComp = dx1;
                    dyComp += dY;
                }
            }

            //
            // finish all tasks
            //
        }

        //
        // Exception handling:
        //
        // TileBufferTask::execute() may have encountered exceptions, but
        // those exceptions occurred in another thread, not in the thread
        // that is executing this call to TiledOutputFile::writeTiles().
        // TileBufferTask::execute() has caught all exceptions and stored
        // the exceptions' what() strings in the tile buffers.
        // Now we check if any tile buffer contains a stored exception; if
        // this is the case then we re-throw the exception in this thread.
        // (It is possible that multiple tile buffers contain stored
        // exceptions.  We re-throw the first exception we find and
        // ignore all others.)
        //

        const string* exception = 0;

        for (size_t i = 0; i < _data->tileBuffers.size (); ++i)
        {
            TileBuffer* tileBuffer = _data->tileBuffers[i];

            if (tileBuffer->hasException && !exception)
                exception = &tileBuffer->exception;

            tileBuffer->hasException = false;
        }

        if (exception) throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Failed to write pixel data to image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}